

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

bool __thiscall Catch::AssertionResult::hasExpandedExpression(AssertionResult *this)

{
  bool bVar1;
  string sStack_58;
  string local_38;
  
  if ((this->m_info).capturedExpression.m_size == 0) {
    bVar1 = false;
  }
  else {
    getExpandedExpression_abi_cxx11_(&sStack_58,this);
    getExpression_abi_cxx11_(&local_38,this);
    bVar1 = std::operator!=(&sStack_58,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&sStack_58);
  }
  return bVar1;
}

Assistant:

constexpr auto empty() const noexcept -> bool {
            return m_size == 0;
        }